

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

void processNode(xmllintState *lint,xmlTextReaderPtr reader)

{
  xmlPatternPtr pxVar1;
  xmlStreamCtxtPtr pxVar2;
  FILE *__stream;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  char *pcVar14;
  
  uVar3 = xmlTextReaderNodeType(reader);
  uVar4 = xmlTextReaderIsEmptyElement(reader);
  if (lint->debug != 0) {
    pcVar9 = (char *)xmlTextReaderConstName(reader);
    pcVar14 = "--";
    if (pcVar9 != (char *)0x0) {
      pcVar14 = pcVar9;
    }
    lVar10 = xmlTextReaderConstValue(reader);
    uVar5 = xmlTextReaderDepth(reader);
    uVar6 = xmlTextReaderHasValue(reader);
    printf("%d %d %s %d %d",(ulong)uVar5,(ulong)uVar3,pcVar14,(ulong)uVar4,(ulong)uVar6);
    if (lVar10 == 0) {
      putchar(10);
    }
    else {
      printf(" %s\n",lVar10);
    }
  }
  pxVar1 = lint->patternc;
  if (pxVar1 == (xmlPatternPtr)0x0) {
    return;
  }
  if (uVar3 == 1) {
    uVar11 = xmlTextReaderCurrentNode(reader);
    iVar7 = xmlPatternMatch(pxVar1,uVar11);
    iVar8 = 0;
    if (iVar7 != 0) {
      uVar11 = xmlTextReaderCurrentNode(reader);
      lVar10 = xmlGetNodePath(uVar11);
      printf("Node %s matches pattern %s\n",lVar10,lint->pattern);
      goto LAB_001092f0;
    }
  }
  else {
    iVar8 = -1;
  }
  iVar7 = iVar8;
  lVar10 = 0;
LAB_001092f0:
  pxVar2 = lint->patstream;
  if (pxVar2 != (xmlStreamCtxtPtr)0x0) {
    if (uVar3 == 1) {
      uVar11 = xmlTextReaderConstLocalName(reader);
      uVar12 = xmlTextReaderConstNamespaceUri(reader);
      iVar8 = xmlStreamPush(pxVar2,uVar11,uVar12);
      if (iVar8 < 0) {
        fwrite("xmlStreamPush() failure\n",0x18,1,(FILE *)lint->errStream);
        xmlFreeStreamCtxt(lint->patstream);
        lint->patstream = (xmlStreamCtxtPtr)0x0;
      }
      else if (iVar8 != iVar7) {
        lVar13 = lVar10;
        if (lVar10 == 0) {
          uVar11 = xmlTextReaderCurrentNode(reader);
          lVar13 = xmlGetNodePath(uVar11);
        }
        fwrite("xmlPatternMatch and xmlStreamPush disagree\n",0x2b,1,(FILE *)lint->errStream);
        __stream = (FILE *)lint->errStream;
        pcVar14 = lint->pattern;
        lVar10 = lVar13;
        if (lVar13 == 0) {
          lVar13 = xmlTextReaderConstName(reader);
          lVar10 = 0;
        }
        fprintf(__stream,"  pattern %s node %s\n",pcVar14,lVar13);
      }
    }
    if (((uVar3 == 0xf) || (uVar3 == 1 && uVar4 != 0)) &&
       (iVar8 = xmlStreamPop(lint->patstream), iVar8 < 0)) {
      fwrite("xmlStreamPop() failure\n",0x17,1,(FILE *)lint->errStream);
      xmlFreeStreamCtxt(lint->patstream);
      lint->patstream = (xmlStreamCtxtPtr)0x0;
    }
  }
  if (lVar10 == 0) {
    return;
  }
  (*_xmlFree)(lVar10);
  return;
}

Assistant:

static void processNode(xmllintState *lint, xmlTextReaderPtr reader) {
    const xmlChar *name, *value;
    int type, empty;

    type = xmlTextReaderNodeType(reader);
    empty = xmlTextReaderIsEmptyElement(reader);

    if (lint->debug) {
	name = xmlTextReaderConstName(reader);
	if (name == NULL)
	    name = BAD_CAST "--";

	value = xmlTextReaderConstValue(reader);


	printf("%d %d %s %d %d",
		xmlTextReaderDepth(reader),
		type,
		name,
		empty,
		xmlTextReaderHasValue(reader));
	if (value == NULL)
	    printf("\n");
	else {
	    printf(" %s\n", value);
	}
    }
#ifdef LIBXML_PATTERN_ENABLED
    if (lint->patternc) {
        xmlChar *path = NULL;
        int match = -1;

	if (type == XML_READER_TYPE_ELEMENT) {
	    /* do the check only on element start */
	    match = xmlPatternMatch(lint->patternc,
                                    xmlTextReaderCurrentNode(reader));

	    if (match) {
		path = xmlGetNodePath(xmlTextReaderCurrentNode(reader));
		printf("Node %s matches pattern %s\n", path, lint->pattern);
	    }
	}
	if (lint->patstream != NULL) {
	    int ret;

	    if (type == XML_READER_TYPE_ELEMENT) {
		ret = xmlStreamPush(lint->patstream,
		                    xmlTextReaderConstLocalName(reader),
				    xmlTextReaderConstNamespaceUri(reader));
		if (ret < 0) {
		    fprintf(lint->errStream, "xmlStreamPush() failure\n");
                    xmlFreeStreamCtxt(lint->patstream);
		    lint->patstream = NULL;
		} else if (ret != match) {
		    if (path == NULL) {
		        path = xmlGetNodePath(
		                       xmlTextReaderCurrentNode(reader));
		    }
		    fprintf(lint->errStream,
		            "xmlPatternMatch and xmlStreamPush disagree\n");
                    if (path != NULL)
                        fprintf(lint->errStream, "  pattern %s node %s\n",
                                lint->pattern, path);
                    else
		        fprintf(lint->errStream, "  pattern %s node %s\n",
			    lint->pattern, xmlTextReaderConstName(reader));
		}

	    }
	    if ((type == XML_READER_TYPE_END_ELEMENT) ||
	        ((type == XML_READER_TYPE_ELEMENT) && (empty))) {
	        ret = xmlStreamPop(lint->patstream);
		if (ret < 0) {
		    fprintf(lint->errStream, "xmlStreamPop() failure\n");
                    xmlFreeStreamCtxt(lint->patstream);
		    lint->patstream = NULL;
		}
	    }
	}
	if (path != NULL)
	    xmlFree(path);
    }
#endif
}